

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::dx
          (value_type *__return_storage_ptr__,FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_> *this
          ,int i)

{
  double dVar1;
  int iVar2;
  Fad<Fad<double>_> *pFVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  Fad<double> *pFVar7;
  
  pFVar3 = this->left_;
  pFVar7 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pFVar7 = (pFVar3->dx_).ptr_to_data + i;
  }
  dVar1 = (this->right_).constant_;
  __return_storage_ptr__->val_ = pFVar7->val_ / dVar1;
  iVar2 = (pFVar7->dx_).num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (0 < (long)iVar2) {
    (__return_storage_ptr__->dx_).num_elts = iVar2;
    pdVar4 = (double *)operator_new__((long)iVar2 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar4;
  }
  __return_storage_ptr__->defaultVal = 0.0;
  lVar5 = (long)(pFVar7->dx_).num_elts;
  if (0 < lVar5) {
    pdVar4 = (__return_storage_ptr__->dx_).ptr_to_data;
    lVar6 = 0;
    do {
      pdVar4[lVar6] = (pFVar7->dx_).ptr_to_data[lVar6] / dVar1;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) / right_.val();}